

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void update_box(j_decompress_ptr cinfo,boxptr boxp)

{
  _func_void_j_decompress_ptr *p_Var1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  short *psVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long local_40;
  
  p_Var1 = cinfo->cquantize[1].finish_pass;
  iVar6 = boxp->c0min;
  iVar15 = boxp->c0max;
  lVar16 = (long)iVar15;
  iVar7 = boxp->c1min;
  lVar8 = (long)iVar7;
  iVar3 = boxp->c1max;
  lVar4 = (long)iVar3;
  iVar2 = boxp->c2min;
  local_40 = (long)iVar2;
  iVar13 = boxp->c2max;
  if (iVar6 < iVar15) {
    for (lVar14 = (long)iVar6; lVar12 = lVar8 << 6, lVar11 = lVar8, lVar14 <= lVar16;
        lVar14 = lVar14 + 1) {
      for (; lVar11 <= lVar4; lVar11 = lVar11 + 1) {
        for (lVar10 = local_40; (int)lVar10 <= iVar13; lVar10 = lVar10 + 1) {
          if (*(short *)(*(long *)(p_Var1 + lVar14 * 8) + lVar12 + lVar10 * 2) != 0) {
            iVar6 = (int)lVar14;
            boxp->c0min = iVar6;
            goto LAB_0023abec;
          }
        }
        lVar12 = lVar12 + 0x40;
      }
    }
  }
LAB_0023abec:
  if (iVar6 < iVar15) {
    for (; lVar14 = lVar8 << 6, lVar12 = lVar8, iVar6 <= lVar16; lVar16 = lVar16 + -1) {
      for (; lVar12 <= lVar4; lVar12 = lVar12 + 1) {
        for (lVar11 = local_40; (int)lVar11 <= iVar13; lVar11 = lVar11 + 1) {
          if (*(short *)(*(long *)(p_Var1 + lVar16 * 8) + lVar14 + lVar11 * 2) != 0) {
            iVar15 = (int)lVar16;
            boxp->c0max = iVar15;
            goto LAB_0023ac59;
          }
        }
        lVar14 = lVar14 + 0x40;
      }
    }
  }
LAB_0023ac59:
  if (iVar7 < iVar3) {
    lVar16 = lVar8 << 6;
    for (; lVar14 = (long)iVar6, lVar8 <= lVar4; lVar8 = lVar8 + 1) {
      for (; lVar14 <= iVar15; lVar14 = lVar14 + 1) {
        for (lVar12 = local_40; (int)lVar12 <= iVar13; lVar12 = lVar12 + 1) {
          if (*(short *)(*(long *)(p_Var1 + lVar14 * 8) + lVar16 + lVar12 * 2) != 0) {
            iVar7 = (int)lVar8;
            boxp->c1min = iVar7;
            goto LAB_0023acb8;
          }
        }
      }
      lVar16 = lVar16 + 0x40;
    }
  }
LAB_0023acb8:
  if (iVar7 < iVar3) {
    lVar8 = lVar4 << 6;
    for (; lVar16 = (long)iVar6, iVar7 <= lVar4; lVar4 = lVar4 + -1) {
      for (; lVar16 <= iVar15; lVar16 = lVar16 + 1) {
        for (lVar14 = local_40; (int)lVar14 <= iVar13; lVar14 = lVar14 + 1) {
          if (*(short *)(*(long *)(p_Var1 + lVar16 * 8) + lVar8 + lVar14 * 2) != 0) {
            iVar3 = (int)lVar4;
            boxp->c1max = iVar3;
            goto LAB_0023ad18;
          }
        }
      }
      lVar8 = lVar8 + -0x40;
    }
  }
LAB_0023ad18:
  lVar4 = (long)iVar13;
  if (iVar2 < iVar13) {
    for (; lVar8 = (long)iVar6, local_40 <= lVar4; local_40 = local_40 + 1) {
      for (; lVar8 <= iVar15; lVar8 = lVar8 + 1) {
        psVar9 = (short *)(*(long *)(p_Var1 + lVar8 * 8) + (long)iVar7 * 0x40 + local_40 * 2);
        for (iVar5 = iVar7; iVar5 <= iVar3; iVar5 = iVar5 + 1) {
          if (*psVar9 != 0) {
            iVar2 = (int)local_40;
            boxp->c2min = iVar2;
            goto LAB_0023ad98;
          }
          psVar9 = psVar9 + 0x20;
        }
      }
    }
  }
LAB_0023ad98:
  if (iVar2 < iVar13) {
    for (; lVar8 = (long)iVar6, iVar2 <= lVar4; lVar4 = lVar4 + -1) {
      for (; lVar8 <= iVar15; lVar8 = lVar8 + 1) {
        psVar9 = (short *)(*(long *)(p_Var1 + lVar8 * 8) + (long)iVar7 * 0x40 + lVar4 * 2);
        for (iVar5 = iVar7; iVar5 <= iVar3; iVar5 = iVar5 + 1) {
          if (*psVar9 != 0) {
            iVar13 = (int)lVar4;
            boxp->c2max = iVar13;
            goto LAB_0023ae24;
          }
          psVar9 = psVar9 + 0x20;
        }
      }
    }
  }
LAB_0023ae24:
  lVar4 = (long)((iVar15 - iVar6) * 0x10);
  lVar8 = (long)((iVar3 - iVar7) * 0xc);
  lVar16 = (long)((iVar13 - iVar2) * 8);
  boxp->volume = lVar16 * lVar16 + lVar4 * lVar4 + lVar8 * lVar8;
  lVar4 = 0;
  for (lVar8 = (long)iVar6; lVar16 = (long)iVar7, lVar8 <= iVar15; lVar8 = lVar8 + 1) {
    for (; lVar16 <= iVar3; lVar16 = lVar16 + 1) {
      psVar9 = (short *)(lVar16 * 0x40 + *(long *)(p_Var1 + lVar8 * 8) + (long)iVar2 * 2);
      for (iVar6 = iVar2; iVar6 <= iVar13; iVar6 = iVar6 + 1) {
        lVar4 = (lVar4 + 1) - (ulong)(*psVar9 == 0);
        psVar9 = psVar9 + 1;
      }
    }
  }
  boxp->colorcount = lVar4;
  return;
}

Assistant:

LOCAL(void)
update_box (j_decompress_ptr cinfo, boxptr boxp)
/* Shrink the min/max bounds of a box to enclose only nonzero elements, */
/* and recompute its volume and population */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  histptr histp;
  int c0,c1,c2;
  int c0min,c0max,c1min,c1max,c2min,c2max;
  INT32 dist0,dist1,dist2;
  long ccount;
  
  c0min = boxp->c0min;  c0max = boxp->c0max;
  c1min = boxp->c1min;  c1max = boxp->c1max;
  c2min = boxp->c2min;  c2max = boxp->c2max;
  
  if (c0max > c0min)
    for (c0 = c0min; c0 <= c0max; c0++)
      for (c1 = c1min; c1 <= c1max; c1++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c0min = c0min = c0;
	    goto have_c0min;
	  }
      }
 have_c0min:
  if (c0max > c0min)
    for (c0 = c0max; c0 >= c0min; c0--)
      for (c1 = c1min; c1 <= c1max; c1++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c0max = c0max = c0;
	    goto have_c0max;
	  }
      }
 have_c0max:
  if (c1max > c1min)
    for (c1 = c1min; c1 <= c1max; c1++)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c1min = c1min = c1;
	    goto have_c1min;
	  }
      }
 have_c1min:
  if (c1max > c1min)
    for (c1 = c1max; c1 >= c1min; c1--)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c1max = c1max = c1;
	    goto have_c1max;
	  }
      }
 have_c1max:
  if (c2max > c2min)
    for (c2 = c2min; c2 <= c2max; c2++)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1min][c2];
	for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
	  if (*histp != 0) {
	    boxp->c2min = c2min = c2;
	    goto have_c2min;
	  }
      }
 have_c2min:
  if (c2max > c2min)
    for (c2 = c2max; c2 >= c2min; c2--)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1min][c2];
	for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
	  if (*histp != 0) {
	    boxp->c2max = c2max = c2;
	    goto have_c2max;
	  }
      }
 have_c2max:

  /* Update box volume.
   * We use 2-norm rather than real volume here; this biases the method
   * against making long narrow boxes, and it has the side benefit that
   * a box is splittable iff norm > 0.
   * Since the differences are expressed in histogram-cell units,
   * we have to shift back to JSAMPLE units to get consistent distances;
   * after which, we scale according to the selected distance scale factors.
   */
  dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
  dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
  dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
  boxp->volume = dist0*dist0 + dist1*dist1 + dist2*dist2;
  
  /* Now scan remaining volume of box and compute population */
  ccount = 0;
  for (c0 = c0min; c0 <= c0max; c0++)
    for (c1 = c1min; c1 <= c1max; c1++) {
      histp = & histogram[c0][c1][c2min];
      for (c2 = c2min; c2 <= c2max; c2++, histp++)
	if (*histp != 0) {
	  ccount++;
	}
    }
  boxp->colorcount = ccount;
}